

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O3

Board ** board_boardAddDups(Board **boards,unsigned_long boardsCount,Board *board,
                           unsigned_long boardNumToAdd)

{
  Board **ppBVar1;
  Board *pBVar2;
  unsigned_long uVar3;
  
  ppBVar1 = (Board **)realloc(boards,(boardsCount + boardNumToAdd) * 8);
  if (boardNumToAdd != 0) {
    uVar3 = 0;
    do {
      pBVar2 = board_dup(board);
      ppBVar1[boardsCount + uVar3] = pBVar2;
      uVar3 = uVar3 + 1;
    } while (boardNumToAdd != uVar3);
  }
  return ppBVar1;
}

Assistant:

Board ** board_boardAddDups(Board ** boards, unsigned long boardsCount, Board * board, unsigned long boardNumToAdd)
{
	unsigned long i;

	boards = (Board **)realloc(boards, sizeof(Board *)*(boardsCount+boardNumToAdd));
	for(i=0;i<boardNumToAdd;i++)
	{
		boards[boardsCount+i] = board_dup(board);
	}

	return boards;
}